

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_delim_join.cpp
# Opt level: O3

vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true> * __thiscall
duckdb::PhysicalDelimJoin::GetChildren
          (vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true>
           *__return_storage_ptr__,PhysicalDelimJoin *this)

{
  pointer prVar1;
  iterator iVar2;
  reference_wrapper<duckdb::PhysicalOperator> *child;
  pointer prVar3;
  pointer *pprVar4;
  reference_wrapper<const_duckdb::PhysicalOperator> local_30;
  
  (__return_storage_ptr__->
  super_vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
  ).
  super__Vector_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
  ).
  super__Vector_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
  ).
  super__Vector_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  prVar3 = (this->super_PhysicalOperator).children.
           super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
           .
           super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  prVar1 = (this->super_PhysicalOperator).children.
           super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
           .
           super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (prVar3 == prVar1) {
    local_30._M_data = this->join;
    iVar2._M_current = (reference_wrapper<const_duckdb::PhysicalOperator> *)0x0;
  }
  else {
    do {
      local_30._M_data = prVar3->_M_data;
      iVar2._M_current =
           (__return_storage_ptr__->
           super_vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
           ).
           super__Vector_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (__return_storage_ptr__->
          super_vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
          ).
          super__Vector_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::
        vector<std::reference_wrapper<duckdb::PhysicalOperator_const>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator_const>>>
        ::_M_realloc_insert<std::reference_wrapper<duckdb::PhysicalOperator_const>>
                  ((vector<std::reference_wrapper<duckdb::PhysicalOperator_const>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator_const>>>
                    *)__return_storage_ptr__,iVar2,&local_30);
      }
      else {
        (iVar2._M_current)->_M_data = local_30._M_data;
        pprVar4 = &(__return_storage_ptr__->
                   super_vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
                   ).
                   super__Vector_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pprVar4 = *pprVar4 + 1;
      }
      prVar3 = prVar3 + 1;
    } while (prVar3 != prVar1);
    pprVar4 = &(__return_storage_ptr__->
               super_vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
               ).
               super__Vector_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    iVar2._M_current =
         (__return_storage_ptr__->
         super_vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
         ).
         super__Vector_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_30._M_data = this->join;
    if (iVar2._M_current !=
        (__return_storage_ptr__->
        super_vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
        ).
        super__Vector_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      (iVar2._M_current)->_M_data = local_30._M_data;
      iVar2._M_current = *pprVar4 + 1;
      *pprVar4 = iVar2._M_current;
      goto LAB_0153e9ff;
    }
  }
  ::std::
  vector<std::reference_wrapper<duckdb::PhysicalOperator_const>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator_const>>>
  ::_M_realloc_insert<std::reference_wrapper<duckdb::PhysicalOperator_const>>
            ((vector<std::reference_wrapper<duckdb::PhysicalOperator_const>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator_const>>>
              *)__return_storage_ptr__,iVar2,&local_30);
  iVar2._M_current =
       (__return_storage_ptr__->
       super_vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
       ).
       super__Vector_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
LAB_0153e9ff:
  pprVar4 = &(__return_storage_ptr__->
             super_vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
             ).
             super__Vector_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_30._M_data = &this->distinct->super_PhysicalOperator;
  if (iVar2._M_current ==
      (__return_storage_ptr__->
      super_vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
      ).
      super__Vector_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    ::std::
    vector<std::reference_wrapper<duckdb::PhysicalOperator_const>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator_const>>>
    ::_M_realloc_insert<std::reference_wrapper<duckdb::PhysicalOperator_const>>
              ((vector<std::reference_wrapper<duckdb::PhysicalOperator_const>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator_const>>>
                *)__return_storage_ptr__,iVar2,&local_30);
  }
  else {
    (iVar2._M_current)->_M_data = local_30._M_data;
    *pprVar4 = *pprVar4 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<const_reference<PhysicalOperator>> PhysicalDelimJoin::GetChildren() const {
	vector<const_reference<PhysicalOperator>> result;
	for (auto &child : children) {
		result.push_back(child.get());
	}
	result.push_back(join);
	result.push_back(distinct);
	return result;
}